

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolor.cpp
# Opt level: O0

QString * __thiscall QColor::name(QColor *this,NameFormat format)

{
  QRgb QVar1;
  int in_EDX;
  QStringView *in_RSI;
  QStringBuilder<char16_t,_QStringView> *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<char16_t,_QStringView> *pQVar2;
  int iVar3;
  QStringView *pQVar4;
  undefined1 local_b8 [40];
  QStringView local_90;
  undefined2 local_7a;
  undefined1 local_60 [40];
  QStringView local_38;
  undefined2 local_22;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = in_RDI;
  if (in_EDX == 0) {
    local_22 = 0x23;
    iVar3 = in_EDX;
    pQVar4 = in_RSI;
    QVar1 = rgba((QColor *)0x0);
    QString::number((uint)local_60,QVar1 | 0x1000000);
    QStringView::QStringView<QString,_true>((QStringView *)CONCAT44(iVar3,in_EDX),(QString *)in_RSI)
    ;
    local_38 = QStringView::right(pQVar4,CONCAT44(iVar3,in_EDX));
    ::operator+(&pQVar2->a,(QStringView *)in_RDI);
    ::QStringBuilder::operator_cast_to_QString(in_RDI);
    QString::~QString((QString *)0x4a83f0);
  }
  else if (in_EDX == 1) {
    local_7a = 0x23;
    iVar3 = in_EDX;
    pQVar4 = in_RSI;
    QVar1 = rgba((QColor *)0x100000001);
    QString::number((longlong)local_b8,QVar1);
    QStringView::QStringView<QString,_true>((QStringView *)CONCAT44(iVar3,in_EDX),(QString *)in_RSI)
    ;
    local_90 = QStringView::right(pQVar4,CONCAT44(iVar3,in_EDX));
    ::operator+(&pQVar2->a,(QStringView *)in_RDI);
    ::QStringBuilder::operator_cast_to_QString(in_RDI);
    QString::~QString((QString *)0x4a847a);
  }
  else {
    QString::QString((QString *)0x4a8485);
    pQVar2 = in_RDI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QString QColor::name(NameFormat format) const
{
    switch (format) {
    case HexRgb:
        return u'#' + QStringView{QString::number(rgba() | 0x1000000, 16)}.right(6);
    case HexArgb:
        // it's called rgba() but it does return AARRGGBB
        return u'#' + QStringView{QString::number(rgba() | Q_INT64_C(0x100000000), 16)}.right(8);
    }
    return QString();
}